

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testWav.cpp
# Opt level: O2

void testWav(string *param_1)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"Testing Wavelet encoder");
  std::endl<char,std::char_traits<char>>(poVar1);
  anon_unknown.dwarf_2cd883::test(1,1);
  anon_unknown.dwarf_2cd883::test(2,2);
  anon_unknown.dwarf_2cd883::test(0x20,0x20);
  anon_unknown.dwarf_2cd883::test(0x400,0x10);
  anon_unknown.dwarf_2cd883::test(0x10,0x400);
  anon_unknown.dwarf_2cd883::test(0x3e5,0x25);
  anon_unknown.dwarf_2cd883::test(0x25,0x3e5);
  anon_unknown.dwarf_2cd883::test(0x400,0x400);
  anon_unknown.dwarf_2cd883::test(0x3e5,0x3e5);
  poVar1 = std::operator<<((ostream *)&std::cout,"ok\n");
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

void
testWav (const std::string&)
{
    try
    {
        cout << "Testing Wavelet encoder" << endl;

        test (1, 1);
        test (2, 2);
        test (32, 32);
        test (1024, 16);
        test (16, 1024);
        test (997, 37);
        test (37, 997);
        test (1024, 1024);
        test (997, 997);

        cout << "ok\n" << endl;
    }
    catch (const std::exception& e)
    {
        cerr << "ERROR -- caught exception: " << e.what () << endl;
        assert (false);
    }
}